

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O1

BOOL __thiscall
Js::GlobalObject::GetRootPropertyReference
          (GlobalObject *this,Var originalInstance,PropertyId propertyId,Var *value,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  RecyclableObject *pRVar1;
  BOOL BVar2;
  uint uVar3;
  
  BVar2 = RootObjectBase::GetRootPropertyReference
                    (&this->super_RootObjectBase,originalInstance,propertyId,value,info,
                     requestContext);
  uVar3 = 1;
  if (BVar2 == 0) {
    pRVar1 = (this->directHostObject).ptr;
    if ((pRVar1 != (RecyclableObject *)0x0) &&
       (BVar2 = JavascriptOperators::GetPropertyReference
                          (pRVar1,propertyId,value,requestContext,info), BVar2 != 0)) {
      return 1;
    }
    pRVar1 = (RecyclableObject *)(this->super_RootObjectBase).hostObject.ptr;
    if (pRVar1 == (RecyclableObject *)0x0) {
      uVar3 = 0;
    }
    else {
      BVar2 = JavascriptOperators::GetPropertyReference(pRVar1,propertyId,value,requestContext,info)
      ;
      uVar3 = (uint)(BVar2 != 0);
    }
  }
  return uVar3;
}

Assistant:

BOOL GlobalObject::GetRootPropertyReference(Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info,
        ScriptContext* requestContext)
    {
        if (__super::GetRootPropertyReference(originalInstance, propertyId, value, info, requestContext))
        {
            return true;
        }
        return (this->directHostObject && JavascriptOperators::GetPropertyReference(this->directHostObject, propertyId, value, requestContext, info)) ||
            (this->hostObject && JavascriptOperators::GetPropertyReference(this->hostObject, propertyId, value, requestContext, info));
    }